

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
TasGrid::Optimizer::evalLagrange
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *nodes,
          vector<double,_std::allocator<double>_> *coeffs,double x)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  size_type __n;
  double dVar8;
  allocator_type local_29;
  double local_28;
  
  __n = (long)(nodes->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(nodes->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3;
  local_28 = x;
  ::std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_29);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar1 = 1.0;
  iVar4 = (int)__n;
  uVar5 = iVar4 - 1;
  pdVar2 = (nodes->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  dVar8 = 1.0;
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    dVar8 = dVar8 * (local_28 - pdVar2[uVar6]);
    pdVar1[uVar6 + 1] = dVar8;
  }
  pdVar2 = (coeffs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1[(int)uVar5] = pdVar1[(int)uVar5] / pdVar2[(int)uVar5];
  pdVar3 = (nodes->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar8 = 1.0;
  for (uVar5 = iVar4 - 2; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
    dVar8 = dVar8 * (local_28 - pdVar3[(ulong)uVar5 + 1]);
    pdVar1[uVar5] = (dVar8 / pdVar2[uVar5]) * pdVar1[uVar5];
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> evalLagrange(std::vector<double> const &nodes, std::vector<double> const &coeffs, double x){
    int num_nodes = (int) nodes.size();
    std::vector<double> lag(nodes.size());
    lag[0] = 1.0;
    for(int i=0; i<num_nodes-1; i++){
        lag[i+1] = (x - nodes[i]) * lag[i];
    }
    double w = 1.0;
    lag[num_nodes-1] /= coeffs[num_nodes-1];
    for(int i= num_nodes-2; i>=0; i--){
        w *= (x - nodes[i+1]);
        lag[i] *= w / coeffs[i];
    }
    return lag;
}